

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnImportGlobal
          (BinaryReaderObjdump *this,Index import_index,string_view module_name,
          string_view field_name,Index global_index,Type type,bool mutable_)

{
  char *pcVar1;
  size_type sVar2;
  const_pointer pcVar3;
  size_type sVar4;
  const_pointer pcVar5;
  bool mutable__local;
  Index import_index_local;
  BinaryReaderObjdump *this_local;
  undefined1 auStack_30 [4];
  Type type_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  _auStack_30 = field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  this_local._4_4_ = type.enum_;
  pcVar1 = Type::GetName((Type *)((long)&this_local + 4));
  PrintDetails(this," - global[%u] %s mutable=%d",(ulong)global_index,pcVar1,(ulong)mutable_);
  sVar2 = string_view::length((string_view *)&field_name_local.size_);
  pcVar3 = string_view::data((string_view *)&field_name_local.size_);
  sVar4 = string_view::length((string_view *)auStack_30);
  pcVar5 = string_view::data((string_view *)auStack_30);
  PrintDetails(this," <- %.*s.%.*s\n",sVar2 & 0xffffffff,pcVar3,sVar4 & 0xffffffff,pcVar5);
  Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnImportGlobal(Index import_index,
                                           string_view module_name,
                                           string_view field_name,
                                           Index global_index,
                                           Type type,
                                           bool mutable_) {
  PrintDetails(" - global[%" PRIindex "] %s mutable=%d", global_index,
               type.GetName(), mutable_);
  PrintDetails(" <- " PRIstringview "." PRIstringview "\n",
               WABT_PRINTF_STRING_VIEW_ARG(module_name),
               WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return Result::Ok;
}